

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_srgb(void *outputp,int width_times_channels,float *encode)

{
  char *pcVar1;
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  char *pcVar5;
  float fVar6;
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  char cVar18;
  char *pcVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar32;
  short sVar33;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  
  auVar16 = _DAT_005eccc0;
  auVar15 = _DAT_005eccb0;
  auVar14 = _DAT_005ecca0;
  auVar13 = _DAT_005ecc90;
  pcVar5 = (char *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    if (3 < width_times_channels) {
      do {
        fVar6 = *encode;
        if (fVar6 <= 0.00012207031) {
          cVar18 = '\0';
        }
        else {
          cVar18 = -1;
          if (fVar6 <= 0.99999994) {
            cVar18 = (char)(((uint)fVar6 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        *(char *)outputp = cVar18;
        fVar6 = encode[1];
        if (fVar6 <= 0.00012207031) {
          cVar18 = '\0';
        }
        else {
          cVar18 = -1;
          if (fVar6 <= 0.99999994) {
            cVar18 = (char)(((uint)fVar6 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        *(char *)((long)outputp + 1) = cVar18;
        fVar6 = encode[2];
        if (fVar6 <= 0.00012207031) {
          cVar18 = '\0';
        }
        else {
          cVar18 = -1;
          if (fVar6 <= 0.99999994) {
            cVar18 = (char)(((uint)fVar6 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        *(char *)((long)outputp + 2) = cVar18;
        fVar6 = encode[3];
        if (fVar6 <= 0.00012207031) {
          cVar18 = '\0';
        }
        else {
          cVar18 = -1;
          if (fVar6 <= 0.99999994) {
            cVar18 = (char)(((uint)fVar6 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        *(char *)((long)outputp + 3) = cVar18;
        encode = encode + 4;
        pcVar1 = (char *)((long)outputp + 4);
        pcVar19 = (char *)((long)outputp + 8);
        outputp = pcVar1;
      } while (pcVar19 <= pcVar5);
    }
    for (; outputp < pcVar5; outputp = (char *)((long)outputp + 1)) {
      fVar6 = *encode;
      if (fVar6 <= 0.00012207031) {
        cVar18 = '\0';
      }
      else {
        cVar18 = -1;
        if (fVar6 <= 0.99999994) {
          cVar18 = (char)(((uint)fVar6 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar6 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)outputp = cVar18;
      encode = encode + 1;
    }
  }
  else {
    pauVar17 = (undefined1 (*) [16])(encode + (long)width_times_channels + -0x10);
    do {
      pcVar1 = (char *)((long)outputp + 0x10);
      pcVar19 = pcVar5 + -0x10;
      if (pcVar1 == pcVar5) {
        pcVar19 = pcVar1;
      }
      pauVar2 = (undefined1 (*) [16])((long)encode + 0x40);
      auVar24 = *(undefined1 (*) [16])encode;
      pauVar3 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar7 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar8 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar9 = (undefined1 (*) [16])((long)encode + 0x10);
      auVar27 = *(undefined1 (*) [16])((long)encode + 0x20);
      pauVar4 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar10 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar11 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar12 = (undefined1 (*) [16])((long)encode + 0x30);
      encode = (float *)pauVar17;
      if (pcVar1 == pcVar5) {
        encode = (float *)pauVar2;
      }
      if (pcVar1 <= pcVar5 + -0x10) {
        encode = (float *)pauVar2;
        pcVar19 = pcVar1;
      }
      auVar52._8_4_ = auVar24._4_4_;
      auVar52._0_8_ = auVar24._0_8_;
      auVar52._12_4_ = *(undefined4 *)(*pauVar7 + 4);
      auVar47._4_4_ = *(undefined4 *)*pauVar3;
      auVar47._0_4_ = auVar24._0_4_;
      auVar45._8_4_ = auVar27._4_4_;
      auVar45._0_8_ = auVar27._0_8_;
      auVar45._12_4_ = *(undefined4 *)(*pauVar10 + 4);
      auVar46._8_8_ = auVar45._8_8_;
      auVar47._12_4_ = *(undefined4 *)*pauVar4;
      auVar47._8_4_ = auVar27._0_4_;
      auVar50._0_8_ = CONCAT44(*(undefined4 *)(*pauVar8 + 8),auVar24._8_4_);
      auVar50._8_4_ = auVar24._12_4_;
      auVar50._12_4_ = *(undefined4 *)(*pauVar9 + 0xc);
      auVar24._0_8_ = CONCAT44(*(undefined4 *)(*pauVar11 + 8),auVar27._8_4_);
      auVar24._8_4_ = auVar27._12_4_;
      auVar24._12_4_ = *(undefined4 *)(*pauVar12 + 0xc);
      auVar46._0_8_ = auVar52._8_8_;
      auVar34._8_8_ = auVar24._0_8_;
      auVar34._0_8_ = auVar50._0_8_;
      auVar27._8_8_ = auVar24._8_8_;
      auVar27._0_8_ = auVar50._8_8_;
      auVar24 = maxps(auVar47,auVar13);
      auVar25 = minps(auVar24,auVar14);
      auVar24 = maxps(auVar46,auVar13);
      auVar47 = minps(auVar24,auVar14);
      auVar24 = maxps(auVar34,auVar13);
      auVar35 = minps(auVar24,auVar14);
      auVar24 = maxps(auVar27,auVar13);
      auVar24 = minps(auVar24,auVar14);
      auVar51._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar25._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar51._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar25._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar51._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar25._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar51._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar25._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar47._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar54._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar47._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar47._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar47._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar55._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar55._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar55._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar55._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar53._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar26._0_4_ = auVar25._0_4_ >> 0xc;
      auVar26._4_4_ = auVar25._4_4_ >> 0xc;
      auVar26._8_4_ = auVar25._8_4_ >> 0xc;
      auVar26._12_4_ = auVar25._12_4_ >> 0xc;
      auVar27 = pmaddwd(auVar26 & auVar15 | auVar16,auVar51);
      auVar28._0_4_ = auVar27._0_4_ >> 0x10;
      auVar28._4_4_ = auVar27._4_4_ >> 0x10;
      auVar28._8_4_ = auVar27._8_4_ >> 0x10;
      auVar28._12_4_ = auVar27._12_4_ >> 0x10;
      auVar48._0_4_ = auVar47._0_4_ >> 0xc;
      auVar48._4_4_ = auVar47._4_4_ >> 0xc;
      auVar48._8_4_ = auVar47._8_4_ >> 0xc;
      auVar48._12_4_ = auVar47._12_4_ >> 0xc;
      auVar27 = pmaddwd(auVar48 & auVar15 | auVar16,auVar54);
      auVar49._0_4_ = auVar27._0_4_ >> 0x10;
      auVar49._4_4_ = auVar27._4_4_ >> 0x10;
      auVar49._8_4_ = auVar27._8_4_ >> 0x10;
      auVar49._12_4_ = auVar27._12_4_ >> 0x10;
      auVar27 = packssdw(auVar28,auVar49);
      auVar36._0_4_ = auVar35._0_4_ >> 0xc;
      auVar36._4_4_ = auVar35._4_4_ >> 0xc;
      auVar36._8_4_ = auVar35._8_4_ >> 0xc;
      auVar36._12_4_ = auVar35._12_4_ >> 0xc;
      auVar25 = pmaddwd(auVar36 & auVar15 | auVar16,auVar55);
      auVar37._0_4_ = auVar25._0_4_ >> 0x10;
      auVar37._4_4_ = auVar25._4_4_ >> 0x10;
      auVar37._8_4_ = auVar25._8_4_ >> 0x10;
      auVar37._12_4_ = auVar25._12_4_ >> 0x10;
      auVar25._0_4_ = auVar24._0_4_ >> 0xc;
      auVar25._4_4_ = auVar24._4_4_ >> 0xc;
      auVar25._8_4_ = auVar24._8_4_ >> 0xc;
      auVar25._12_4_ = auVar24._12_4_ >> 0xc;
      auVar24 = pmaddwd(auVar25 & auVar15 | auVar16,auVar53);
      auVar35._0_4_ = auVar24._0_4_ >> 0x10;
      auVar35._4_4_ = auVar24._4_4_ >> 0x10;
      auVar35._8_4_ = auVar24._8_4_ >> 0x10;
      auVar35._12_4_ = auVar24._12_4_ >> 0x10;
      auVar24 = packssdw(auVar37,auVar35);
      sVar40 = auVar24._6_2_;
      sVar23 = auVar27._6_2_;
      sVar39 = auVar24._4_2_;
      sVar22 = auVar27._4_2_;
      sVar38 = auVar24._2_2_;
      sVar21 = auVar27._2_2_;
      sVar20 = auVar27._0_2_;
      sVar33 = auVar24._0_2_;
      sVar29 = auVar27._8_2_;
      sVar41 = auVar24._8_2_;
      sVar30 = auVar27._10_2_;
      sVar42 = auVar24._10_2_;
      sVar31 = auVar27._12_2_;
      sVar43 = auVar24._12_2_;
      sVar32 = auVar27._14_2_;
      sVar44 = auVar24._14_2_;
      *(char *)outputp = (0 < sVar20) * (sVar20 < 0x100) * auVar27[0] - (0xff < sVar20);
      *(char *)((long)outputp + 1) = (0 < sVar29) * (sVar29 < 0x100) * auVar27[8] - (0xff < sVar29);
      *(char *)((long)outputp + 2) = (0 < sVar33) * (sVar33 < 0x100) * auVar24[0] - (0xff < sVar33);
      *(char *)((long)outputp + 3) = (0 < sVar41) * (sVar41 < 0x100) * auVar24[8] - (0xff < sVar41);
      *(char *)((long)outputp + 4) = (0 < sVar21) * (sVar21 < 0x100) * auVar27[2] - (0xff < sVar21);
      *(char *)((long)outputp + 5) = (0 < sVar30) * (sVar30 < 0x100) * auVar27[10] - (0xff < sVar30)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar38) * (sVar38 < 0x100) * auVar24[2] - (0xff < sVar38);
      *(char *)((long)outputp + 7) = (0 < sVar42) * (sVar42 < 0x100) * auVar24[10] - (0xff < sVar42)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar22) * (sVar22 < 0x100) * auVar27[4] - (0xff < sVar22);
      *(char *)((long)outputp + 9) =
           (0 < sVar31) * (sVar31 < 0x100) * auVar27[0xc] - (0xff < sVar31);
      *(char *)((long)outputp + 10) = (0 < sVar39) * (sVar39 < 0x100) * auVar24[4] - (0xff < sVar39)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar43) * (sVar43 < 0x100) * auVar24[0xc] - (0xff < sVar43);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar23) * (sVar23 < 0x100) * auVar27[6] - (0xff < sVar23);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar32) * (sVar32 < 0x100) * auVar27[0xe] - (0xff < sVar32);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar40) * (sVar40 < 0x100) * auVar24[6] - (0xff < sVar40);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar44) * (sVar44 < 0x100) * auVar24[0xe] - (0xff < sVar44);
      outputp = pcVar19;
    } while (pcVar1 != pcVar5);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;
      STBIR_SIMD_NO_UNROLL(encode);

      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__min_max_shift20( i3, f3 );

      stbir__simdi_table_lookup4( i0, i1, i2, i3, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );
      stbir__linear_to_srgb_finish( i3, f3 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      encode += 16;
      output += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while ( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(encode);

    output[0-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    output[1-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    output[2-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    output[3-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order3] );

    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(encode);
    output[0] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    #if stbir__coder_min_num >= 2
    output[1] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}